

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgNameAllocator.cpp
# Opt level: O0

string * __thiscall
rsg::nameNdxToStr_abi_cxx11_(string *__return_storage_ptr__,rsg *this,deUint32 name)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined8 local_48;
  undefined8 local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  uint local_28;
  deUint32 alphabetLen;
  allocator<char> local_16;
  undefined1 local_15;
  uint local_14;
  string *psStack_10;
  deUint32 name_local;
  string *str;
  
  local_14 = (uint)this;
  local_15 = 0;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_16);
  std::allocator<char>::~allocator(&local_16);
  local_28 = 0x1a;
  for (; local_28 < local_14; local_14 = (local_14 - 1) / local_28) {
    local_38._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_30,&local_38);
    local_40 = std::__cxx11::string::insert
                         (__return_storage_ptr__,local_30,
                          (int)(char)((char)((local_14 - 1) % local_28) + 'a'));
  }
  local_50._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_48,&local_50);
  std::__cxx11::string::insert
            (__return_storage_ptr__,local_48,(int)(char)((char)(local_14 % (local_28 + 1)) + '`'));
  return __return_storage_ptr__;
}

Assistant:

inline std::string nameNdxToStr (deUint32 name)
{
	std::string	str			= "";
	deUint32	alphabetLen	= 'z' - 'a' + 1;

	while (name > alphabetLen)
	{
		str.insert(str.begin(), (char)('a' + ((name-1)%alphabetLen)));
		name = ((name-1) / alphabetLen);
	}

	str.insert(str.begin(), (char)('a' + (name%(alphabetLen+1)) - 1));

	return str;
}